

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warnings.cpp
# Opt level: O3

UniValue *
node::GetWarningsForRpc(UniValue *__return_storage_ptr__,Warnings *warnings,bool use_deprecated)

{
  pointer pcVar1;
  UniValue val;
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  _Alloc_hider val_00;
  long in_FS_OFFSET;
  vector<bilingual_str,_std::allocator<bilingual_str>_> all_messages;
  _Alloc_hider in_stack_ffffffffffffff18;
  pointer in_stack_ffffffffffffff20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffff28;
  _Alloc_hider in_stack_ffffffffffffff38;
  size_type in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff50 [32];
  vector<UniValue,_std::allocator<UniValue>_> local_90;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined8 local_67;
  undefined4 local_5f;
  undefined2 local_5b;
  char local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000011,use_deprecated) == 0) {
    local_78 = &local_68;
    __return_storage_ptr__->typ = VARR;
    (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2
    ;
    (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
    *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 1) = local_67;
    *(undefined4 *)((long)&(__return_storage_ptr__->val).field_2 + 9) = local_5f;
    *(undefined2 *)((long)&(__return_storage_ptr__->val).field_2 + 0xd) = local_5b;
    (__return_storage_ptr__->val).field_2._M_local_buf[0xf] = local_59;
    (__return_storage_ptr__->val)._M_string_length = 0;
    local_70 = 0;
    local_68 = 0;
    (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->keys).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->keys).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->keys).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    Warnings::GetMessages
              ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)&local_58,warnings);
    if (local_58._M_dataplus._M_p != (pointer)local_58._M_string_length) {
      val_00._M_p = local_58._M_dataplus._M_p;
      do {
        ::UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((UniValue *)&stack0xffffffffffffff30,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val_00._M_p)
        ;
        val.val._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff20;
        val._0_8_ = in_stack_ffffffffffffff18._M_p;
        val.val._8_16_ = in_stack_ffffffffffffff28;
        val.val.field_2._8_8_ = in_stack_ffffffffffffff38._M_p;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffff40;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffff48;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)in_stack_ffffffffffffff50._0_8_;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data =
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffff50._8_24_;
        ::UniValue::push_back(__return_storage_ptr__,val);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_90);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&stack0xffffffffffffff58);
        if (in_stack_ffffffffffffff38._M_p != &stack0xffffffffffffff48) {
          operator_delete(in_stack_ffffffffffffff38._M_p,in_stack_ffffffffffffff48 + 1);
        }
        val_00._M_p = val_00._M_p + 0x40;
      } while (val_00._M_p != (pointer)local_58._M_string_length);
    }
    this = &local_58;
  }
  else {
    Warnings::GetMessages
              ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)&stack0xffffffffffffff18,
               warnings);
    if ((pointer)in_stack_ffffffffffffff18._M_p == in_stack_ffffffffffffff20) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
    }
    else {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      pcVar1 = in_stack_ffffffffffffff20[-1].original._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar1,
                 pcVar1 + in_stack_ffffffffffffff20[-1].original._M_string_length);
    }
    ::UniValue::
    UniValue<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,&local_58);
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &stack0xffffffffffffff18;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff18;
    }
  }
  std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector
            ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

UniValue GetWarningsForRpc(const Warnings& warnings, bool use_deprecated)
{
    if (use_deprecated) {
        const auto all_messages{warnings.GetMessages()};
        return all_messages.empty() ? "" : all_messages.back().original;
    }

    UniValue messages{UniValue::VARR};
    for (auto&& message : warnings.GetMessages()) {
        messages.push_back(std::move(message.original));
    }
    return messages;
}